

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gopt-errors.c
# Opt level: O0

void gopt_errors(char *argv0,option *options)

{
  long in_RSI;
  undefined8 in_RDI;
  uint i;
  uint bad_option_index;
  uint local_18;
  uint local_14;
  
  local_14 = 0;
  while ((*(uint *)(in_RSI + (ulong)local_14 * 0x20 + 0x10) & 0x100) == 0) {
    local_14 = local_14 + 1;
  }
  if (*(char *)(in_RSI + (ulong)local_14 * 0x20) != '\0') {
    fprintf(_stderr,"%s: unrecognised option -%c\n",in_RDI,
            (ulong)(uint)(int)*(char *)(in_RSI + (ulong)local_14 * 0x20));
    exit(1);
  }
  if (*(long *)(in_RSI + (ulong)local_14 * 0x20 + 8) != 0) {
    fprintf(_stderr,"%s: unrecognised option --%s\n",in_RDI,
            *(undefined8 *)(in_RSI + (ulong)local_14 * 0x20 + 8));
    exit(1);
  }
  local_18 = 0;
  while( true ) {
    if (local_14 <= local_18) {
      return;
    }
    if (((*(uint *)(in_RSI + (ulong)local_18 * 0x20 + 0x10) & 0x10) != 0) &&
       ((*(uint *)(in_RSI + (ulong)local_18 * 0x20 + 0x10) & 2) != 0)) {
      fprintf(_stderr,"%s: option -%c requires an option-argument\n",in_RDI,
              (ulong)(uint)(int)*(char *)(in_RSI + (ulong)local_18 * 0x20));
      exit(1);
    }
    if (((*(uint *)(in_RSI + (ulong)local_18 * 0x20 + 0x10) & 0x20) != 0) &&
       ((*(uint *)(in_RSI + (ulong)local_18 * 0x20 + 0x10) & 1) != 0)) {
      fprintf(_stderr,"%s: option -%c must not have an option-argument\n",in_RDI,
              (ulong)(uint)(int)*(char *)(in_RSI + (ulong)local_18 * 0x20));
      exit(1);
    }
    if (((*(uint *)(in_RSI + (ulong)local_18 * 0x20 + 0x10) & 0x40) != 0) &&
       ((*(uint *)(in_RSI + (ulong)local_18 * 0x20 + 0x10) & 2) != 0)) {
      fprintf(_stderr,"%s: option --%s requires an option-argument\n",in_RDI,
              *(undefined8 *)(in_RSI + (ulong)local_18 * 0x20 + 8));
      exit(1);
    }
    if (((*(uint *)(in_RSI + (ulong)local_18 * 0x20 + 0x10) & 0x80) != 0) &&
       ((*(uint *)(in_RSI + (ulong)local_18 * 0x20 + 0x10) & 1) != 0)) break;
    if ((1 < *(uint *)(in_RSI + (ulong)local_18 * 0x20 + 0x14)) &&
       ((*(uint *)(in_RSI + (ulong)local_18 * 0x20 + 0x10) & 8) == 0)) {
      fprintf(_stderr,"%s: option -%c/--%s may not be repeated\n",in_RDI,
              (ulong)(uint)(int)*(char *)(in_RSI + (ulong)local_18 * 0x20),
              *(undefined8 *)(in_RSI + (ulong)local_18 * 0x20 + 8));
      exit(1);
    }
    local_18 = local_18 + 1;
  }
  fprintf(_stderr,"%s: option --%s must not have an option-argument\n",in_RDI,
          *(undefined8 *)(in_RSI + (ulong)local_18 * 0x20 + 8));
  exit(1);
}

Assistant:

void gopt_errors (const char *argv0, const struct option *options)
{
  unsigned int bad_option_index = 0;
  unsigned int i;

  while (!(options[bad_option_index].flags & GOPT_LAST))
  {
    bad_option_index++;
  }

  if (options[bad_option_index].short_name)
  {
    fprintf (stderr, "%s: unrecognised option -%c\n", argv0, options[bad_option_index].short_name);
    exit (EX_USAGE);
  }

  if (options[bad_option_index].long_name)
  {
    fprintf (stderr, "%s: unrecognised option --%s\n", argv0, options[bad_option_index].long_name);
    exit (EX_USAGE);
  }

  for (i = 0; i < bad_option_index; i++)
  {
    if ((options[i].flags & GOPT_SEEN_SHORT_WITHOUT) && (options[i].flags & GOPT_ARGUMENT_REQUIRED))
    {
      fprintf (stderr, "%s: option -%c requires an option-argument\n", argv0, options[i].short_name);
      exit (EX_USAGE);
    }

    if ((options[i].flags & GOPT_SEEN_SHORT_WITH) && (options[i].flags & GOPT_ARGUMENT_FORBIDDEN))
    {
      fprintf (stderr, "%s: option -%c must not have an option-argument\n", argv0, options[i].short_name);
      exit (EX_USAGE);
    }

    if ((options[i].flags & GOPT_SEEN_LONG_WITHOUT) && (options[i].flags & GOPT_ARGUMENT_REQUIRED))
    {
      fprintf (stderr, "%s: option --%s requires an option-argument\n", argv0, options[i].long_name);
      exit (EX_USAGE);
    }

    if ((options[i].flags & GOPT_SEEN_LONG_WITH) && (options[i].flags & GOPT_ARGUMENT_FORBIDDEN))
    {
      fprintf (stderr, "%s: option --%s must not have an option-argument\n", argv0, options[i].long_name);
      exit (EX_USAGE);
    }

    if ((options[i].count > 1) && !(options[i].flags & GOPT_REPEATABLE))
    {
      fprintf (stderr, "%s: option -%c/--%s may not be repeated\n", argv0, options[i].short_name, options[i].long_name);
      exit (EX_USAGE);
    }
  }
}